

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab_session.cpp
# Opt level: O1

void __thiscall cab_session::handle_update(cab_session *this)

{
  buffer *buffer;
  pointer puVar1;
  pointer puVar2;
  cab *this_00;
  ssize_t sVar3;
  ostream *poVar4;
  pointer __dest;
  ptrdiff_t _Num;
  void *__buf;
  size_t sVar5;
  void *__buf_00;
  node_type *pnVar6;
  backend_route_update_message *message;
  backend_position_update_message *message_00;
  pointer puVar7;
  ulong uVar8;
  backend_position_update_message position_message;
  message_header header;
  buffer_reader reader;
  backend_route_update_message route_message;
  backend_position_update_message local_91;
  message_header local_90;
  buffer_reader local_88;
  backend_route_update_message local_68;
  vector<node_type,_std::allocator<node_type>_> local_48;
  
  local_68.route.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (node_type *)0x0;
  local_68.route.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (node_type *)0x0;
  local_68.route.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buffer = &this->_buffer;
  if (4 < (ulong)((long)(this->_buffer).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->_buffer).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start)) {
    buffer_reader::buffer_reader(&local_88,buffer);
    ::operator>>(&local_88,&local_90);
    if ((local_90.id == BACKEND_POSITION_UPDATE) &&
       (sVar5 = (size_t)local_90.size,
       sVar5 <= (ulong)((long)(this->_buffer).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->_buffer).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start))) {
      buffer_reader::buffer_reader(&local_88,buffer);
      message_00 = &local_91;
      ::operator>>(&local_88,message_00);
      puVar1 = (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar3 = buffer_reader::read(&local_88,(int)message_00,__buf_00,sVar5);
      if (sVar3 != 0) {
        puVar7 = puVar1 + sVar3;
        sVar5 = (long)(this->_buffer).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar7;
        if (sVar5 != 0) {
          memmove(puVar1,puVar7,sVar5);
        }
        puVar2 = (this->_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (puVar2 != puVar1 + ((long)puVar2 - (long)puVar7)) {
          (this->_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar1 + ((long)puVar2 - (long)puVar7);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cab with id ",0xc);
      cab::id(this->_cab);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," moved to ",10);
      poVar4 = ::operator<<(poVar4,local_91.position);
      local_88._buffer = (buffer *)CONCAT71(local_88._buffer._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_88,1);
      cab::update_position(this->_cab,local_91.position);
      goto LAB_0016ac67;
    }
  }
  if (4 < (ulong)((long)(this->_buffer).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->_buffer).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start)) {
    buffer_reader::buffer_reader(&local_88,buffer);
    ::operator>>(&local_88,&local_90);
    if ((local_90.id == BACKEND_ROUTE_UPDATE) &&
       (sVar5 = (size_t)local_90.size,
       sVar5 <= (ulong)((long)(this->_buffer).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->_buffer).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start))) {
      buffer_reader::buffer_reader(&local_88,buffer);
      message = &local_68;
      ::operator>>(&local_88,message);
      puVar1 = (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar3 = buffer_reader::read(&local_88,(int)message,__buf,sVar5);
      if (sVar3 != 0) {
        puVar7 = puVar1 + sVar3;
        sVar5 = (long)(this->_buffer).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar7;
        if (sVar5 != 0) {
          memmove(puVar1,puVar7,sVar5);
        }
        puVar2 = (this->_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (puVar2 != puVar1 + ((long)puVar2 - (long)puVar7)) {
          (this->_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar1 + ((long)puVar2 - (long)puVar7);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cab with id ",0xc);
      cab::id(this->_cab);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," updated its route\n",0x13);
      local_88._buffer = (buffer *)0x0;
      local_88._start = 0;
      local_88._index = 0;
      std::vector<node_type,_std::allocator<node_type>_>::reserve
                ((vector<node_type,_std::allocator<node_type>_> *)&local_88,
                 (ulong)(((int)local_68.route.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (int)local_68.route.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start) + 9));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"received route: ",0x10);
      puVar1 = local_68.route.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (local_68.route.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_68.route.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pnVar6 = local_68.route.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        do {
          local_90.size = CONCAT31(local_90.size._1_3_,*pnVar6);
          if (local_88._start == local_88._index) {
            std::vector<node_type,_std::allocator<node_type>_>::_M_realloc_insert<node_type>
                      ((vector<node_type,_std::allocator<node_type>_> *)&local_88,
                       (iterator)local_88._start,(node_type *)&local_90);
          }
          else {
            *(node_type *)local_88._start = *pnVar6;
            local_88._start = local_88._start + 1;
          }
          poVar4 = ::operator<<((ostream *)&std::cout,*(node_type *)(local_88._start + -1));
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
          pnVar6 = pnVar6 + 1;
        } while (pnVar6 != puVar1);
      }
      local_90.size = CONCAT31(local_90.size._1_3_,10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_90,1);
      this_00 = this->_cab;
      local_48.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar8 = local_88._start - (long)local_88._buffer;
      if (uVar8 == 0) {
        __dest = (pointer)0x0;
      }
      else {
        if ((long)uVar8 < 0) {
          std::__throw_bad_alloc();
        }
        __dest = (pointer)operator_new(uVar8);
      }
      local_48.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = __dest + uVar8;
      sVar5 = local_88._start - (long)local_88._buffer;
      local_48.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
      super__Vector_impl_data._M_start = __dest;
      if (sVar5 != 0) {
        local_48.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
        super__Vector_impl_data._M_finish = __dest;
        memmove(__dest,local_88._buffer,sVar5);
      }
      local_48.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
      super__Vector_impl_data._M_finish = __dest + sVar5;
      cab::update_route(this_00,&local_48);
      if (local_48.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<node_type,_std::allocator<node_type>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<node_type,_std::allocator<node_type>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_88._buffer != (buffer *)0x0) {
        operator_delete(local_88._buffer,local_88._index - (long)local_88._buffer);
      }
    }
  }
LAB_0016ac67:
  handle_receive(this);
  if (local_68.route.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (node_type *)0x0) {
    operator_delete(local_68.route.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.route.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.route.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void cab_session::handle_update()
{
    backend_position_update_message position_message;
    backend_route_update_message route_message;
    if(position_message.readable(_buffer))
    {
        position_message.from_buffer(_buffer);

        std::cout << "Cab with id " << _cab->id() << " moved to " << static_cast<node_type>(position_message.position) << '\n';

        _cab->update_position(static_cast<node_type>(position_message.position));
    }
    else if(route_message.readable(_buffer))
    {
        route_message.from_buffer(_buffer);

        std::cout << "Cab with id " << _cab->id() << " updated its route\n";

        std::vector<node_type> converted;
        converted.reserve(route_message.size());
        std::cout << "received route: ";
        for(auto e : route_message.route)
        {
            converted.push_back(static_cast<node_type>(e));
            std::cout << converted.back() << ", ";
        }
        std::cout << '\n';
        _cab->update_route(converted);
    }

    handle_receive();
}